

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O1

int SmoothenBlock(uint8_t *a_ptr,int a_stride,uint8_t *y_ptr,int y_stride,int width,int height)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint8_t *puVar6;
  
  if (height < 1) {
    iVar3 = 0;
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    iVar2 = 0;
    iVar3 = 0;
    puVar4 = a_ptr;
    puVar6 = y_ptr;
    do {
      if (0 < width) {
        uVar5 = 0;
        do {
          if (puVar4[uVar5] != '\0') {
            iVar3 = iVar3 + 1;
            iVar1 = iVar1 + (uint)puVar6[uVar5];
          }
          uVar5 = uVar5 + 1;
        } while ((uint)width != uVar5);
      }
      puVar4 = puVar4 + a_stride;
      puVar6 = puVar6 + y_stride;
      iVar2 = iVar2 + 1;
    } while (iVar2 != height);
  }
  if (((0 < iVar3) && (iVar3 < height * width)) && (0 < height)) {
    iVar2 = 0;
    do {
      if (0 < width) {
        uVar5 = 0;
        do {
          if (a_ptr[uVar5] == '\0') {
            y_ptr[uVar5] = (uint8_t)(iVar1 / iVar3);
          }
          uVar5 = uVar5 + 1;
        } while ((uint)width != uVar5);
      }
      a_ptr = a_ptr + a_stride;
      y_ptr = y_ptr + y_stride;
      iVar2 = iVar2 + 1;
    } while (iVar2 != height);
  }
  return (uint)(iVar3 == 0);
}

Assistant:

static int SmoothenBlock(const uint8_t* a_ptr, int a_stride, uint8_t* y_ptr,
                         int y_stride, int width, int height) {
  int sum = 0, count = 0;
  int x, y;
  const uint8_t* alpha_ptr = a_ptr;
  uint8_t* luma_ptr = y_ptr;
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      if (alpha_ptr[x] != 0) {
        ++count;
        sum += luma_ptr[x];
      }
    }
    alpha_ptr += a_stride;
    luma_ptr += y_stride;
  }
  if (count > 0 && count < width * height) {
    const uint8_t avg_u8 = (uint8_t)(sum / count);
    alpha_ptr = a_ptr;
    luma_ptr = y_ptr;
    for (y = 0; y < height; ++y) {
      for (x = 0; x < width; ++x) {
        if (alpha_ptr[x] == 0) luma_ptr[x] = avg_u8;
      }
      alpha_ptr += a_stride;
      luma_ptr += y_stride;
    }
  }
  return (count == 0);
}